

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

void __thiscall
chaiscript::exception::file_not_found_error::file_not_found_error
          (file_not_found_error *this,string *t_filename)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"File Not Found: ",t_filename);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__file_not_found_error_003c0ca0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (t_filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + t_filename->_M_string_length);
  return;
}

Assistant:

explicit file_not_found_error(const std::string &t_filename)
          : std::runtime_error("File Not Found: " + t_filename)
          , filename(t_filename) {
      }